

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

bool __thiscall ON_SubDHeap::GrowEdgeFaceArray(ON_SubDHeap *this,ON_SubDEdge *e,size_t capacity)

{
  ON_SubDFacePtr *pOVar1;
  bool bVar2;
  size_t current_count;
  size_t xcapacity;
  size_t local_18;
  
  if (e == (ON_SubDEdge *)0x0) {
    ON_SubDIncrementErrorCount();
    bVar2 = false;
  }
  else {
    if (capacity == 0) {
      capacity = (ulong)e->m_face_count + 1;
    }
    bVar2 = true;
    if ((ulong)e->m_facex_capacity + 2 < capacity) {
      local_18 = capacity - 2;
      current_count = 0;
      if (2 < e->m_face_count) {
        current_count = (ulong)(e->m_face_count - 2);
      }
      pOVar1 = (ON_SubDFacePtr *)
               ResizeArray(this,current_count,(ulong)e->m_facex_capacity,&e->m_facex->m_ptr,
                           &local_18);
      bVar2 = pOVar1 != (ON_SubDFacePtr *)0x0;
      if (pOVar1 == (ON_SubDFacePtr *)0x0) {
        e->m_face_count = 0;
        e->m_facex_capacity = 0;
        e->m_facex = (ON_SubDFacePtr *)0x0;
        ON_SubDIncrementErrorCount();
      }
      else {
        e->m_facex = pOVar1;
        e->m_facex_capacity = (unsigned_short)local_18;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_SubDHeap::GrowEdgeFaceArray(
  ON_SubDEdge* e,
  size_t capacity
  )
{
  if ( nullptr == e)
    return ON_SUBD_RETURN_ERROR(false);
  if ( 0 == capacity )
    capacity = e->m_face_count+1;
  if ( capacity <= (size_t)(2 + e->m_facex_capacity))
    return true;
  size_t xcapacity = capacity-2;
  ON__UINT_PTR* a = ResizeArray((e->m_face_count>2) ? (e->m_face_count-2) : 0,e->m_facex_capacity,(ON__UINT_PTR*)e->m_facex,&xcapacity);
  if ( nullptr == a )
  {
    e->m_face_count = 0;
    e->m_facex_capacity = 0;
    e->m_facex = nullptr;
    return ON_SUBD_RETURN_ERROR(false);
  }
  e->m_facex = (ON_SubDFacePtr*)a;
  e->m_facex_capacity = (unsigned short)xcapacity;
  return true;
}